

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

void duckdb::TimeBucketFunction<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  unsigned_long *puVar1;
  BucketWidthType BVar2;
  reference left;
  reference right;
  NotImplementedException *this;
  idx_t count;
  code *fun;
  interval_t in_stack_ffffffffffffffa8;
  string local_48;
  
  left = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  right = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  if (left->vector_type == CONSTANT_VECTOR) {
    puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      ConstantVector::SetNull(result,true);
      return;
    }
    BVar2 = TimeBucket::ClassifyBucketWidth(in_stack_ffffffffffffffa8);
    if (BVar2 != UNCLASSIFIED) {
      if (BVar2 == CONVERTIBLE_TO_MONTHS) {
        count = args->count;
        fun = TimeBucket::WidthConvertibleToMonthsBinaryOperator::
              Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>;
      }
      else {
        if (BVar2 != CONVERTIBLE_TO_MICROS) {
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_48,"Bucket type not implemented for TIME_BUCKET",
                     (allocator *)&stack0xffffffffffffffb7);
          NotImplementedException::NotImplementedException(this,&local_48);
          __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
        }
        count = args->count;
        fun = TimeBucket::WidthConvertibleToMicrosBinaryOperator::
              Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>;
      }
      goto LAB_01c6f3ee;
    }
  }
  count = args->count;
  fun = TimeBucket::BinaryOperator::
        Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>;
LAB_01c6f3ee:
  BinaryExecutor::
  ExecuteSwitch<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::BinaryLambdaWrapper,bool,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t)>
            (left,right,result,count,fun);
  return;
}

Assistant:

static void TimeBucketFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);

	auto &bucket_width_arg = args.data[0];
	auto &ts_arg = args.data[1];

	if (bucket_width_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(bucket_width_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			interval_t bucket_width = *ConstantVector::GetData<interval_t>(bucket_width_arg);
			TimeBucket::BucketWidthType bucket_width_type = TimeBucket::ClassifyBucketWidth(bucket_width);
			switch (bucket_width_type) {
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MICROS:
				BinaryExecutor::Execute<interval_t, T, T>(
				    bucket_width_arg, ts_arg, result, args.size(),
				    TimeBucket::WidthConvertibleToMicrosBinaryOperator::Operation<interval_t, T, T>);
				break;
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MONTHS:
				BinaryExecutor::Execute<interval_t, T, T>(
				    bucket_width_arg, ts_arg, result, args.size(),
				    TimeBucket::WidthConvertibleToMonthsBinaryOperator::Operation<interval_t, T, T>);
				break;
			case TimeBucket::BucketWidthType::UNCLASSIFIED:
				BinaryExecutor::Execute<interval_t, T, T>(bucket_width_arg, ts_arg, result, args.size(),
				                                          TimeBucket::BinaryOperator::Operation<interval_t, T, T>);
				break;
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}
	} else {
		BinaryExecutor::Execute<interval_t, T, T>(bucket_width_arg, ts_arg, result, args.size(),
		                                          TimeBucket::BinaryOperator::Operation<interval_t, T, T>);
	}
}